

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteGeneratedCodeInfo
          (ReflectionClassGenerator *this,Descriptor *descriptor,Printer *printer,bool last)

{
  int iVar1;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *descriptor_00;
  FieldDescriptor *extraout_RDX_00;
  EnumDescriptor *extraout_RDX_01;
  EnumDescriptor *extraout_RDX_02;
  EnumDescriptor *descriptor_01;
  EnumDescriptor *extraout_RDX_03;
  int i_1;
  int i;
  long lVar2;
  char *pcVar3;
  int i_3;
  long lVar4;
  ulong uVar5;
  string sStack_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  
  if (*(char *)(*(long *)(descriptor + 0x20) + 0x6b) == '\x01') {
    io::Printer::Print(printer,"null, ");
    return;
  }
  GetClassName_abi_cxx11_(&sStack_88,(csharp *)descriptor,(Descriptor *)printer);
  io::Printer::Print(printer,
                     "new pbr::GeneratedClrTypeInfo(typeof($type_name$), $type_name$.Parser, ",
                     "type_name",&sStack_88);
  std::__cxx11::string::~string((string *)&sStack_88);
  iVar1 = *(int *)(descriptor + 0x2c);
  if (iVar1 < 1) {
    io::Printer::Print(printer,"null, ");
  }
  else {
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar4 = 0;
    descriptor_00 = extraout_RDX;
    for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
      GetPropertyName_abi_cxx11_
                (&sStack_88,(csharp *)(*(long *)(descriptor + 0x30) + lVar4),descriptor_00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&fields,
                 &sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
      iVar1 = *(int *)(descriptor + 0x2c);
      lVar4 = lVar4 + 0xa8;
      descriptor_00 = extraout_RDX_00;
    }
    JoinStrings(&sStack_88,&fields,"\", \"");
    io::Printer::Print(printer,"new[]{ \"$fields$\" }, ","fields",&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&fields);
  }
  iVar1 = *(int *)(descriptor + 0x38);
  if (iVar1 < 1) {
    io::Printer::Print(printer,"null, ");
    descriptor_01 = extraout_RDX_02;
  }
  else {
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar4 = 0;
    for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
      UnderscoresToCamelCase(&sStack_88,*(string **)(*(long *)(descriptor + 0x40) + lVar4),true);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&fields,
                 &sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
      iVar1 = *(int *)(descriptor + 0x38);
      lVar4 = lVar4 + 0x30;
    }
    JoinStrings(&sStack_88,&fields,"\", \"");
    io::Printer::Print(printer,"new[]{ \"$oneofs$\" }, ","oneofs",&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&fields);
    descriptor_01 = extraout_RDX_01;
  }
  iVar1 = *(int *)(descriptor + 0x58);
  if (iVar1 < 1) {
    io::Printer::Print(printer,"null, ");
  }
  else {
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar4 = 0;
    for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
      GetClassName_abi_cxx11_
                (&sStack_88,(csharp *)(*(long *)(descriptor + 0x60) + lVar4),descriptor_01);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&fields,
                 &sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
      iVar1 = *(int *)(descriptor + 0x58);
      lVar4 = lVar4 + 0x38;
      descriptor_01 = extraout_RDX_03;
    }
    JoinStrings(&sStack_88,&fields,"), typeof(");
    io::Printer::Print(printer,"new[]{ typeof($enums$) }, ","enums",&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&fields);
  }
  if (*(int *)(descriptor + 0x48) < 1) {
    pcVar3 = "null";
  }
  else {
    io::Printer::Print(printer,"new pbr::GeneratedClrTypeInfo[] { ");
    lVar2 = 0;
    pcVar3 = "}";
    for (uVar5 = 0; (long)uVar5 < (long)*(int *)(descriptor + 0x48); uVar5 = uVar5 + 1) {
      WriteGeneratedCodeInfo
                (this,(Descriptor *)(*(long *)(descriptor + 0x50) + lVar2),printer,
                 uVar5 == *(int *)(descriptor + 0x48) - 1);
      lVar2 = lVar2 + 0xa8;
    }
  }
  io::Printer::Print(printer,pcVar3);
  pcVar3 = "),\n";
  if (last) {
    pcVar3 = ")";
  }
  io::Printer::Print(printer,pcVar3);
  return;
}

Assistant:

void ReflectionClassGenerator::WriteGeneratedCodeInfo(const Descriptor* descriptor, io::Printer* printer, bool last) {
  if (IsMapEntryMessage(descriptor)) {
    printer->Print("null, ");
    return;
  }
  // Generated message type
  printer->Print("new pbr::GeneratedClrTypeInfo(typeof($type_name$), $type_name$.Parser, ", "type_name", GetClassName(descriptor));
  
  // Fields
  if (descriptor->field_count() > 0) {
      std::vector<std::string> fields;
      for (int i = 0; i < descriptor->field_count(); i++) {
          fields.push_back(GetPropertyName(descriptor->field(i)));
      }
      printer->Print("new[]{ \"$fields$\" }, ", "fields", JoinStrings(fields, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Oneofs
  if (descriptor->oneof_decl_count() > 0) {
      std::vector<std::string> oneofs;
      for (int i = 0; i < descriptor->oneof_decl_count(); i++) {
          oneofs.push_back(UnderscoresToCamelCase(descriptor->oneof_decl(i)->name(), true));
      }
      printer->Print("new[]{ \"$oneofs$\" }, ", "oneofs", JoinStrings(oneofs, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Nested enums
  if (descriptor->enum_type_count() > 0) {
      std::vector<std::string> enums;
      for (int i = 0; i < descriptor->enum_type_count(); i++) {
          enums.push_back(GetClassName(descriptor->enum_type(i)));
      }
      printer->Print("new[]{ typeof($enums$) }, ", "enums", JoinStrings(enums, "), typeof("));
  }
  else {
      printer->Print("null, ");
  }

  // Nested types
  if (descriptor->nested_type_count() > 0) {
      // Need to specify array type explicitly here, as all elements may be null. 
      printer->Print("new pbr::GeneratedClrTypeInfo[] { ");
      for (int i = 0; i < descriptor->nested_type_count(); i++) {
          WriteGeneratedCodeInfo(descriptor->nested_type(i), printer, i == descriptor->nested_type_count() - 1);
      }
      printer->Print("}");
  }
  else {
      printer->Print("null");
  }
  printer->Print(last ? ")" : "),\n");
}